

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O1

Instr * __thiscall LowererMD::SIMD128LowerReplaceLane_2(LowererMD *this,Instr *instr)

{
  Opnd *dst;
  Opnd *src;
  Opnd *opnd;
  code *pcVar1;
  OpndKind OVar2;
  bool bVar3;
  uint index;
  BOOL BVar4;
  SList<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  Type *ppOVar5;
  undefined4 *puVar6;
  IntConstOpnd *pIVar7;
  Instr *pIVar8;
  MemRefOpnd *pMVar9;
  
  this_00 = Simd128GetExtendedArgs(this,instr);
  ppOVar5 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>);
  dst = *ppOVar5;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>,
             this_00->allocator);
  ppOVar5 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>);
  src = *ppOVar5;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>,
             this_00->allocator);
  ppOVar5 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>);
  pIVar7 = (IntConstOpnd *)*ppOVar5;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>,
             this_00->allocator);
  ppOVar5 = SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>);
  opnd = *ppOVar5;
  SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&this_00->super_SListBase<IR::Opnd_*,_Memory::ArenaAllocator,_RealCount>,
             this_00->allocator);
  OVar2 = IR::Opnd::GetKind((Opnd *)pIVar7);
  if (OVar2 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) goto LAB_00674d14;
    *puVar6 = 0;
  }
  index = IR::IntConstOpnd::AsInt32(pIVar7);
  bVar3 = IRType_IsSimd128(dst->m_type);
  if (bVar3) {
    bVar3 = IRType_IsSimd128(src->m_type);
    if (!bVar3) goto LAB_00674a11;
  }
  else {
LAB_00674a11:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                       ,0x206,"(dst->IsSimd128() && src1->IsSimd128())",
                       "dst->IsSimd128() && src1->IsSimd128()");
    if (!bVar3) goto LAB_00674d14;
    *puVar6 = 0;
  }
  if (instr->m_opcode == Simd128_ReplaceLane_D2) {
    BVar4 = AutoSystemInfo::SSE2Available(&AutoSystemInfo::Data);
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x20a,"(AutoSystemInfo::Data.SSE2Available())","SSE2 not supported");
      if (!bVar3) goto LAB_00674d14;
      *puVar6 = 0;
    }
    if (opnd->m_type != TyFloat64) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x20b,"(src3->IsFloat64())","src3->IsFloat64()");
      if (!bVar3) {
LAB_00674d14:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    Lowerer::InsertMove(dst,src,instr,true);
    if (index == 0) {
      pIVar8 = IR::Instr::New(MOVSD,dst,opnd,this->m_func);
    }
    else {
      pIVar7 = IR::IntConstOpnd::New(0,TyInt8,this->m_func,true);
      pIVar8 = IR::Instr::New(SHUFPD,dst,opnd,&pIVar7->super_Opnd,this->m_func);
    }
    IR::Instr::InsertBefore(instr,pIVar8);
  }
  else {
    bVar3 = IRType_IsInt64(opnd->m_type);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x218,"(src3->IsInt64())","src3->IsInt64()");
      if (!bVar3) goto LAB_00674d14;
      *puVar6 = 0;
    }
    BVar4 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
    if (BVar4 == 0) {
      LoadHelperArgument(this,instr,(Opnd *)pIVar7);
      LoadInt64HelperArgument(this,instr,opnd);
      pMVar9 = LoadSimdHelperArgument(this,instr,'\0');
      Lowerer::InsertMove(&pMVar9->super_Opnd,src,instr,true);
      pMVar9 = LoadSimdHelperArgument(this,instr,'\x01');
      pIVar8 = IR::Instr::New(CALL,this->m_func);
      IR::Instr::InsertBefore(instr,pIVar8);
      ChangeToHelperCall(this,pIVar8,HelperSimd128ReplaceLaneI2,(LabelInstr *)0x0,(Opnd *)0x0,
                         (PropertySymOpnd *)0x0,false);
      Lowerer::InsertMove(dst,&pMVar9->super_Opnd,instr,true);
    }
    else {
      Lowerer::InsertMove(dst,src,instr,true);
      IR::Instr::SetDst(instr,dst);
      EmitInsertInt64(this,opnd,index,instr);
    }
  }
  pIVar8 = instr->m_prev;
  IR::Instr::Remove(instr);
  return pIVar8;
}

Assistant:

IR::Instr * LowererMD::SIMD128LowerReplaceLane_2(IR::Instr *instr)
{
    SList<IR::Opnd*> *args = Simd128GetExtendedArgs(instr);
    IR::Opnd *dst = args->Pop();
    IR::Opnd *src1 = args->Pop();
    IR::Opnd *src2 = args->Pop();
    IR::Opnd *src3 = args->Pop();

    int lane = src2->AsIntConstOpnd()->AsInt32();
    Assert(dst->IsSimd128() && src1->IsSimd128());

    if (instr->m_opcode == Js::OpCode::Simd128_ReplaceLane_D2)
    {
        AssertMsg(AutoSystemInfo::Data.SSE2Available(), "SSE2 not supported");
        Assert(src3->IsFloat64());
        m_lowerer->InsertMove(dst, src1, instr);
        if (lane) 
        {
            instr->InsertBefore(IR::Instr::New(Js::OpCode::SHUFPD, dst, src3, IR::IntConstOpnd::New(0, TyInt8, m_func, true), m_func));
        }
        else 
        {
            instr->InsertBefore(IR::Instr::New(Js::OpCode::MOVSD, dst, src3, m_func));
        }    
        return removeInstr(instr);
    }

    Assert(src3->IsInt64());

    if (AutoSystemInfo::Data.SSE4_1Available())
    {
        m_lowerer->InsertMove(dst, src1, instr);
        instr->SetDst(dst);
        EmitInsertInt64(src3, lane, instr);
    }
    else
    {
        LoadHelperArgument(instr, src2);
        LoadInt64HelperArgument(instr, src3);
        IR::MemRefOpnd* srcMemRef = LoadSimdHelperArgument(instr, 0);
        m_lowerer->InsertMove(srcMemRef, src1, instr);
        IR::MemRefOpnd* dstMemRef = LoadSimdHelperArgument(instr, 1);
        IR::Instr * helperCall = IR::Instr::New(Js::OpCode::CALL, this->m_func);
        instr->InsertBefore(helperCall);
        this->ChangeToHelperCall(helperCall, IR::HelperSimd128ReplaceLaneI2);
        m_lowerer->InsertMove(dst, dstMemRef, instr);
    }
    return removeInstr(instr);
}